

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O2

void __thiscall
Granulator::Grain::Setup
          (Grain *this,GranulatorSample *_sample,int _channel,Random *random,float sampletime,
          int delaypos,float *params,float startsample,int _wrapping)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  this->sample = _sample;
  this->channel = _channel;
  this->wrapping = _wrapping;
  fVar1 = (float)(_sample->numsamples + -1);
  fVar2 = Random::GetFloat(random,params[1],params[4] + params[1]);
  fVar2 = fVar2 * fVar1;
  this->length = (int)fVar2;
  fVar3 = Random::GetFloat(random,params[6] - params[3],params[6]);
  this->offset = ((ABS(fVar3) - ABS(fVar3 + -1.0)) + 1.0) * 0.5 * fVar1 + (float)delaypos;
  fVar1 = Random::GetFloat(random,*params,params[2] + *params);
  fVar1 = (float)this->sample->samplerate *
          (ABS(0.001 - fVar1) + fVar1 + 0.001) * 0.5 * (1.0 / (float)(int)fVar2) * sampletime;
  this->speed = fVar1;
  this->pos = -fVar1 * startsample;
  fVar1 = params[9];
  fVar2 = Random::GetFloat(random,-params[10],params[10]);
  this->pan = fVar2 + fVar1;
  this->shape = params[0xb];
  return;
}

Assistant:

inline void Setup(GranulatorSample* _sample, int _channel, Random& random, const float sampletime, const int delaypos, const float* params, float startsample, int _wrapping)
        {
            sample = _sample;
            channel = _channel;
            wrapping = _wrapping;
            float maxtime = sample->numsamples - 1;
            length = (int)(maxtime * random.GetFloat(params[P_WLEN], params[P_WLEN] + params[P_RWLEN]));
            float invlength = 1.0f / (float)length;
            offset = delaypos + maxtime * FastClip(random.GetFloat(params[P_OFFSET] - params[P_ROFS], params[P_OFFSET]), 0.0f, 1.0f);
            speed = FastMax(0.001f, random.GetFloat(params[P_SPEED], params[P_SPEED] + params[P_RSPEED])) * invlength * sample->samplerate * sampletime;
            pos = -speed * startsample;
            pan = params[P_PANBASE] + random.GetFloat(-params[P_PANRANGE], params[P_PANRANGE]);
            shape = params[P_SHAPE];
        }